

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct64_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 *puVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i u [64];
  longlong local_b40;
  longlong lStack_b38;
  longlong lStack_b30;
  longlong lStack_b28;
  int local_a60;
  int iStack_a5c;
  int iStack_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int iStack_a48;
  int iStack_a44;
  int local_a40;
  int iStack_a3c;
  int iStack_a38;
  int iStack_a34;
  int iStack_a30;
  int iStack_a2c;
  int iStack_a28;
  int iStack_a24;
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  __m256i local_840;
  __m256i local_820;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  longlong local_7e0;
  longlong lStack_7d8;
  longlong lStack_7d0;
  longlong lStack_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  longlong local_7a0;
  longlong lStack_798;
  longlong lStack_790;
  longlong lStack_788;
  longlong local_780;
  longlong lStack_778;
  longlong lStack_770;
  longlong lStack_768;
  longlong local_760;
  longlong lStack_758;
  longlong lStack_750;
  longlong lStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  lVar11 = (long)bit * 0x100;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  auVar20._4_4_ = iVar13;
  auVar20._0_4_ = iVar13;
  auVar20._8_4_ = iVar13;
  auVar20._12_4_ = iVar13;
  auVar20._16_4_ = iVar13;
  auVar20._20_4_ = iVar13;
  auVar20._24_4_ = iVar13;
  auVar20._28_4_ = iVar13;
  iVar13 = bd + (uint)(do_cols == 0) * 2;
  local_a60 = 0x8000;
  if (0xf < iVar13 + 6) {
    local_a60 = 1 << ((char)iVar13 + 5U & 0x1f);
  }
  local_a40 = -local_a60;
  local_a60 = local_a60 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x164);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x16c);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x170);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x25c);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  iVar17 = -iVar13;
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x244);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x17c);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar48._16_4_ = uVar1;
  auVar48._20_4_ = uVar1;
  auVar48._24_4_ = uVar1;
  auVar48._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x174);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x24c);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar53._4_4_ = iVar15;
  auVar53._0_4_ = iVar15;
  auVar53._8_4_ = iVar15;
  auVar53._12_4_ = iVar15;
  auVar53._16_4_ = iVar15;
  auVar53._20_4_ = iVar15;
  auVar53._24_4_ = iVar15;
  auVar53._28_4_ = iVar15;
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x254);
  auVar40._4_4_ = iVar15;
  auVar40._0_4_ = iVar15;
  auVar40._8_4_ = iVar15;
  auVar40._12_4_ = iVar15;
  auVar40._16_4_ = iVar15;
  auVar40._20_4_ = iVar15;
  auVar40._24_4_ = iVar15;
  auVar40._28_4_ = iVar15;
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  puVar7 = local_440;
  auVar2 = vpmulld_avx2((undefined1  [32])in[1],auVar49);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_8a0 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  local_60 = local_8a0;
  auVar2 = vpmulld_avx2((undefined1  [32])in[1],auVar52);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_900 = vpsrad_avx2(auVar2,ZEXT416((uint)bit));
  local_440 = local_900;
  auVar2 = vpmulld_avx2((undefined1  [32])in[7],auVar53);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar56 = ZEXT416((uint)bit);
  local_940 = vpsrad_avx2(auVar2,auVar56);
  auVar50._4_4_ = iVar15;
  auVar50._0_4_ = iVar15;
  auVar50._8_4_ = iVar15;
  auVar50._12_4_ = iVar15;
  auVar50._16_4_ = iVar15;
  auVar50._20_4_ = iVar15;
  auVar50._24_4_ = iVar15;
  auVar50._28_4_ = iVar15;
  local_360 = local_940;
  auVar2 = vpmulld_avx2((undefined1  [32])in[7],auVar48);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_140 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2((undefined1  [32])in[5],auVar45);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_160 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2((undefined1  [32])in[5],auVar43);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_880 = vpsrad_avx2(auVar2,auVar56);
  local_340 = local_880;
  auVar2 = vpmulld_avx2((undefined1  [32])in[3],auVar40);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar56 = ZEXT416((uint)bit);
  local_860 = vpsrad_avx2(auVar2,auVar56);
  local_260 = local_860;
  auVar2 = vpmulld_avx2((undefined1  [32])in[3],auVar33);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_240 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2((undefined1  [32])in[2],auVar29);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_460 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2((undefined1  [32])in[2],auVar36);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_640 = vpsrad_avx2(auVar2,auVar56);
  auVar3 = vpmulld_avx2((undefined1  [32])in[6],auVar50);
  auVar21 = vpmulld_avx2((undefined1  [32])in[6],auVar23);
  auVar24._4_4_ = iVar17;
  auVar24._0_4_ = iVar17;
  auVar24._8_4_ = iVar17;
  auVar24._12_4_ = iVar17;
  auVar24._16_4_ = iVar17;
  auVar24._20_4_ = iVar17;
  auVar24._24_4_ = iVar17;
  auVar24._28_4_ = iVar17;
  auVar2 = vpmulld_avx2(local_900,auVar24);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x250);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar18 = vpmulld_avx2(local_8a0,auVar37);
  auVar2 = vpaddd_avx2(auVar2,auVar18);
  auVar25._4_4_ = iVar13;
  auVar25._0_4_ = iVar13;
  auVar25._8_4_ = iVar13;
  auVar25._12_4_ = iVar13;
  auVar25._16_4_ = iVar13;
  auVar25._20_4_ = iVar13;
  auVar25._24_4_ = iVar13;
  auVar25._28_4_ = iVar13;
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  local_8e0 = vpsrad_avx2(auVar3,auVar56);
  local_560 = local_8e0;
  auVar3 = vpaddd_avx2(auVar21,auVar20);
  local_8c0 = vpsrad_avx2(auVar3,auVar56);
  local_540 = local_8c0;
  auVar19 = vpmulld_avx2((undefined1  [32])in[4],auVar25);
  auVar22 = vpmulld_avx2((undefined1  [32])in[4],auVar37);
  auVar3 = vpmulld_avx2(local_900,auVar37);
  auVar21 = vpmulld_avx2(local_8a0,auVar25);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1d0);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x1f0);
  auVar38._4_4_ = iVar13;
  auVar38._0_4_ = iVar13;
  auVar38._8_4_ = iVar13;
  auVar38._12_4_ = iVar13;
  auVar38._16_4_ = iVar13;
  auVar38._20_4_ = iVar13;
  auVar38._24_4_ = iVar13;
  auVar38._28_4_ = iVar13;
  auVar41._4_4_ = iVar15;
  auVar41._0_4_ = iVar15;
  auVar41._8_4_ = iVar15;
  auVar41._12_4_ = iVar15;
  auVar41._16_4_ = iVar15;
  auVar41._20_4_ = iVar15;
  auVar41._24_4_ = iVar15;
  auVar41._28_4_ = iVar15;
  auVar21 = vpmulld_avx2(local_140,auVar38);
  auVar21 = vpaddd_avx2(auVar20,auVar21);
  auVar18 = vpmulld_avx2(local_940,auVar41);
  auVar21 = vpaddd_avx2(auVar18,auVar21);
  iVar13 = -iVar13;
  auVar44._4_4_ = iVar13;
  auVar44._0_4_ = iVar13;
  auVar44._8_4_ = iVar13;
  auVar44._12_4_ = iVar13;
  auVar44._16_4_ = iVar13;
  auVar44._20_4_ = iVar13;
  auVar44._24_4_ = iVar13;
  auVar44._28_4_ = iVar13;
  auVar23 = vpmulld_avx2(local_940,auVar44);
  auVar18 = vpmulld_avx2(local_140,auVar41);
  auVar18 = vpaddd_avx2(auVar20,auVar18);
  auVar18 = vpaddd_avx2(auVar23,auVar18);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1b0);
  iVar15 = -iVar13;
  auVar46._4_4_ = iVar15;
  auVar46._0_4_ = iVar15;
  auVar46._8_4_ = iVar15;
  auVar46._12_4_ = iVar15;
  auVar46._16_4_ = iVar15;
  auVar46._20_4_ = iVar15;
  auVar46._24_4_ = iVar15;
  auVar46._28_4_ = iVar15;
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_660 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpaddd_avx2(auVar22,auVar20);
  local_740 = vpsrad_avx2(auVar19,auVar56);
  auVar56 = ZEXT416((uint)bit);
  local_9a0 = vpsrad_avx2(auVar2,auVar56);
  local_920 = vpsrad_avx2(auVar3,auVar56);
  local_80 = local_920;
  local_960 = vpsrad_avx2(auVar21,auVar56);
  local_980 = vpsrad_avx2(auVar18,auVar56);
  local_420 = local_9a0;
  local_380 = local_980;
  local_120 = local_960;
  auVar2 = vpmulld_avx2(local_880,auVar46);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x210);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  auVar3 = vpmulld_avx2(local_160,auVar30);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_880,auVar30);
  auVar31._4_4_ = iVar13;
  auVar31._0_4_ = iVar13;
  auVar31._8_4_ = iVar13;
  auVar31._12_4_ = iVar13;
  auVar31._16_4_ = iVar13;
  auVar31._20_4_ = iVar13;
  auVar31._24_4_ = iVar13;
  auVar31._28_4_ = iVar13;
  auVar21 = vpmulld_avx2(local_160,auVar31);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 400);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar11 + 0x230);
  iVar17 = -iVar13;
  local_320 = vpsrad_avx2(auVar2,auVar56);
  auVar26._4_4_ = iVar17;
  auVar26._0_4_ = iVar17;
  auVar26._8_4_ = iVar17;
  auVar26._12_4_ = iVar17;
  auVar26._16_4_ = iVar17;
  auVar26._20_4_ = iVar17;
  auVar26._24_4_ = iVar17;
  auVar26._28_4_ = iVar17;
  local_180 = vpsrad_avx2(auVar3,auVar56);
  auVar21._4_4_ = iVar15;
  auVar21._0_4_ = iVar15;
  auVar21._8_4_ = iVar15;
  auVar21._12_4_ = iVar15;
  auVar21._16_4_ = iVar15;
  auVar21._20_4_ = iVar15;
  auVar21._24_4_ = iVar15;
  auVar21._28_4_ = iVar15;
  auVar2 = vpmulld_avx2(local_860,auVar26);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_240,auVar21);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar21 = vpmulld_avx2(local_860,auVar21);
  auVar27._4_4_ = iVar13;
  auVar27._0_4_ = iVar13;
  auVar27._8_4_ = iVar13;
  auVar27._12_4_ = iVar13;
  auVar27._16_4_ = iVar13;
  auVar27._20_4_ = iVar13;
  auVar27._24_4_ = iVar13;
  auVar27._28_4_ = iVar13;
  auVar3 = vpmulld_avx2(local_240,auVar27);
  auVar3 = vpaddd_avx2(auVar20,auVar3);
  auVar3 = vpaddd_avx2(auVar21,auVar3);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  auVar22._4_4_ = iVar15;
  auVar22._0_4_ = iVar15;
  auVar22._8_4_ = iVar15;
  auVar22._12_4_ = iVar15;
  auVar22._16_4_ = iVar15;
  auVar22._20_4_ = iVar15;
  auVar22._24_4_ = iVar15;
  auVar22._28_4_ = iVar15;
  iVar17 = -iVar13;
  auVar28._4_4_ = iVar17;
  auVar28._0_4_ = iVar17;
  auVar28._8_4_ = iVar17;
  auVar28._12_4_ = iVar17;
  auVar28._16_4_ = iVar17;
  auVar28._20_4_ = iVar17;
  auVar28._24_4_ = iVar17;
  auVar28._28_4_ = iVar17;
  local_280 = vpsrad_avx2(auVar2,auVar56);
  local_220 = vpsrad_avx2(auVar3,auVar56);
  auVar2 = vpmulld_avx2(local_460,auVar22);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar3 = vpmulld_avx2(local_640,auVar28);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_9c0._4_4_ = iVar13;
  local_9c0._0_4_ = iVar13;
  local_9c0._8_4_ = iVar13;
  local_9c0._12_4_ = iVar13;
  local_9c0._16_4_ = iVar13;
  local_9c0._20_4_ = iVar13;
  local_9c0._24_4_ = iVar13;
  local_9c0._28_4_ = iVar13;
  auVar3 = vpmulld_avx2(local_640,auVar22);
  auVar21 = vpmulld_avx2(local_460,local_9c0);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  uVar10 = *(uint *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  iVar17 = -iVar13;
  auVar18._4_4_ = iVar17;
  auVar18._0_4_ = iVar17;
  auVar18._8_4_ = iVar17;
  auVar18._12_4_ = iVar17;
  auVar18._16_4_ = iVar17;
  auVar18._20_4_ = iVar17;
  auVar18._24_4_ = iVar17;
  auVar18._28_4_ = iVar17;
  local_a10 = ZEXT416(uVar10);
  iVar17 = -uVar10;
  local_a00 = vpsrad_avx2(auVar2,auVar56);
  auVar32._4_4_ = iVar17;
  auVar32._0_4_ = iVar17;
  auVar32._8_4_ = iVar17;
  auVar32._12_4_ = iVar17;
  auVar32._16_4_ = iVar17;
  auVar32._20_4_ = iVar17;
  auVar32._24_4_ = iVar17;
  auVar32._28_4_ = iVar17;
  local_9e0 = vpsrad_avx2(auVar3,auVar56);
  local_480 = local_9e0;
  local_620 = local_a00;
  auVar2 = vpmulld_avx2(local_8e0,auVar18);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_8c0,auVar32);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar51._4_4_ = iVar13;
  auVar51._0_4_ = iVar13;
  auVar51._8_4_ = iVar13;
  auVar51._12_4_ = iVar13;
  auVar51._16_4_ = iVar13;
  auVar51._20_4_ = iVar13;
  auVar51._24_4_ = iVar13;
  auVar51._28_4_ = iVar13;
  auVar21 = vpmulld_avx2(local_8e0,auVar32);
  auVar3 = vpmulld_avx2(local_8c0,auVar51);
  auVar3 = vpaddd_avx2(auVar20,auVar3);
  auVar3 = vpaddd_avx2(auVar21,auVar3);
  local_580 = vpsrad_avx2(auVar2,auVar56);
  local_520 = vpsrad_avx2(auVar3,auVar56);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  iVar9 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  auVar47._4_4_ = iVar17;
  auVar47._0_4_ = iVar17;
  auVar47._8_4_ = iVar17;
  auVar47._12_4_ = iVar17;
  auVar47._16_4_ = iVar17;
  auVar47._20_4_ = iVar17;
  auVar47._24_4_ = iVar17;
  auVar47._28_4_ = iVar17;
  auVar42._4_4_ = iVar9;
  auVar42._0_4_ = iVar9;
  auVar42._8_4_ = iVar9;
  auVar42._12_4_ = iVar9;
  auVar42._16_4_ = iVar9;
  auVar42._20_4_ = iVar9;
  auVar42._24_4_ = iVar9;
  auVar42._28_4_ = iVar9;
  iVar14 = -iVar13;
  auVar54._4_4_ = iVar14;
  auVar54._0_4_ = iVar14;
  auVar54._8_4_ = iVar14;
  auVar54._12_4_ = iVar14;
  auVar54._16_4_ = iVar14;
  auVar54._20_4_ = iVar14;
  auVar54._24_4_ = iVar14;
  auVar54._28_4_ = iVar14;
  auVar2 = vpmulld_avx2(auVar47,(undefined1  [32])*in);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  alVar4 = (__m256i)vpsrad_avx2(auVar2,auVar56);
  local_820[0] = alVar4[0];
  local_820[1] = alVar4[1];
  local_820[2] = alVar4[2];
  local_820[3] = alVar4[3];
  local_840[0] = alVar4[0];
  local_840[1] = alVar4[1];
  local_840[2] = alVar4[2];
  local_840[3] = alVar4[3];
  auVar2 = vpmulld_avx2(local_660,auVar42);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_740,auVar54);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_720 = vpsrad_avx2(auVar2,auVar56);
  auVar55._4_4_ = iVar13;
  auVar55._0_4_ = iVar13;
  auVar55._8_4_ = iVar13;
  auVar55._12_4_ = iVar13;
  auVar55._16_4_ = iVar13;
  auVar55._20_4_ = iVar13;
  auVar55._24_4_ = iVar13;
  auVar55._28_4_ = iVar13;
  auVar2 = vpmulld_avx2(local_740,auVar42);
  auVar3 = vpmulld_avx2(local_660,auVar55);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_680 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_9a0,auVar28);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_920,auVar22);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_9a0,auVar22);
  auVar21 = vpmulld_avx2(local_920,local_9c0);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  local_a0 = vpsrad_avx2(auVar3,auVar56);
  auVar56 = ZEXT416((uint)bit);
  local_400 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_8a0,auVar22);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar3 = vpmulld_avx2(local_900,auVar28);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar21 = vpmulld_avx2(local_8a0,local_9c0);
  auVar3 = vpmulld_avx2(local_900,auVar22);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  local_c0 = vpsrad_avx2(auVar3,auVar56);
  local_3e0 = vpsrad_avx2(auVar2,auVar56);
  iVar15 = -iVar15;
  auVar19._4_4_ = iVar15;
  auVar19._0_4_ = iVar15;
  auVar19._8_4_ = iVar15;
  auVar19._12_4_ = iVar15;
  auVar19._16_4_ = iVar15;
  auVar19._20_4_ = iVar15;
  auVar19._24_4_ = iVar15;
  auVar19._28_4_ = iVar15;
  auVar2 = vpmulld_avx2(local_940,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_140,auVar28);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar21 = vpmulld_avx2(local_940,auVar28);
  auVar3 = vpmulld_avx2(local_140,auVar22);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  local_e0 = vpsrad_avx2(auVar3,auVar56);
  local_3c0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_980,auVar19);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_960,auVar28);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar21 = vpmulld_avx2(local_980,auVar28);
  auVar3 = vpmulld_avx2(local_960,auVar22);
  auVar3 = vpaddd_avx2(auVar20,auVar3);
  auVar3 = vpaddd_avx2(auVar21,auVar3);
  local_100 = vpsrad_avx2(auVar3,auVar56);
  local_3a0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_180,auVar51);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar3 = vpmulld_avx2(local_320,auVar32);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar34._4_4_ = uVar10;
  auVar34._0_4_ = uVar10;
  auVar34._8_4_ = uVar10;
  auVar34._12_4_ = uVar10;
  auVar34._16_4_ = uVar10;
  auVar34._20_4_ = uVar10;
  auVar34._24_4_ = uVar10;
  auVar34._28_4_ = uVar10;
  auVar3 = vpmulld_avx2(local_320,auVar51);
  auVar21 = vpmulld_avx2(local_180,auVar34);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  local_1a0 = vpsrad_avx2(auVar3,auVar56);
  local_300 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_160,auVar51);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar3 = vpmulld_avx2(local_880,auVar32);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar21 = vpmulld_avx2(local_160,auVar34);
  auVar3 = vpmulld_avx2(local_880,auVar51);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  local_2e0 = vpsrad_avx2(auVar2,auVar56);
  local_1c0 = vpsrad_avx2(auVar3,auVar56);
  auVar2 = vpmulld_avx2(local_860,auVar18);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar3 = vpmulld_avx2(local_240,auVar32);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_2c0 = vpsrad_avx2(auVar2,auVar56);
  auVar3 = vpmulld_avx2(local_860,auVar32);
  auVar2 = vpmulld_avx2(local_240,auVar51);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_1e0 = vpsrad_avx2(auVar2,auVar56);
  auVar3 = vpmulld_avx2(local_280,auVar18);
  auVar21 = vpmulld_avx2(local_280,auVar32);
  auVar18 = vpmulld_avx2(local_220,auVar32);
  auVar2 = vpmulld_avx2(local_220,auVar51);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2(auVar21,auVar2);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  local_200 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpaddd_avx2(auVar3,auVar18);
  local_2a0 = vpsrad_avx2(auVar2,auVar56);
  iVar9 = -iVar9;
  local_b40 = alVar4[0];
  lStack_b38 = alVar4[1];
  lStack_b30 = alVar4[2];
  lStack_b28 = alVar4[3];
  local_7e0 = local_b40;
  lStack_7d8 = lStack_b38;
  lStack_7d0 = lStack_b30;
  lStack_7c8 = lStack_b28;
  local_800 = local_b40;
  lStack_7f8 = lStack_b38;
  lStack_7f0 = lStack_b30;
  lStack_7e8 = lStack_b28;
  auVar35._4_4_ = iVar9;
  auVar35._0_4_ = iVar9;
  auVar35._8_4_ = iVar9;
  auVar35._12_4_ = iVar9;
  auVar35._16_4_ = iVar9;
  auVar35._20_4_ = iVar9;
  auVar35._24_4_ = iVar9;
  auVar35._28_4_ = iVar9;
  local_6e0 = local_740;
  local_700 = local_720;
  local_6c0 = local_660;
  local_6a0 = local_680;
  auVar3 = vpmulld_avx2(local_a00,auVar54);
  auVar2 = vpmulld_avx2(local_9e0,auVar42);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_600 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_a00,auVar42);
  auVar3 = vpmulld_avx2(local_9e0,auVar55);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_4a0 = vpsrad_avx2(auVar2,auVar56);
  auVar3 = vpmulld_avx2(local_640,auVar54);
  auVar2 = vpmulld_avx2(local_460,auVar42);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_5e0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_640,auVar42);
  auVar3 = vpmulld_avx2(local_460,auVar55);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_4c0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_8e0,auVar35);
  auVar3 = vpmulld_avx2(local_8c0,auVar54);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_5c0 = vpsrad_avx2(auVar2,auVar56);
  auVar3 = vpmulld_avx2(local_8e0,auVar54);
  auVar2 = vpmulld_avx2(local_8c0,auVar42);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_4e0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_580,auVar35);
  auVar3 = vpmulld_avx2(local_520,auVar54);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  iVar17 = -iVar17;
  local_5a0 = vpsrad_avx2(auVar2,auVar56);
  auVar3 = vpmulld_avx2(local_580,auVar54);
  auVar2 = vpmulld_avx2(local_520,auVar42);
  auVar2 = vpaddd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  local_500 = vpsrad_avx2(auVar2,auVar56);
  auVar3._4_4_ = local_a40;
  auVar3._0_4_ = local_a40;
  auVar3._8_4_ = local_a40;
  auVar3._12_4_ = local_a40;
  auVar3._16_4_ = local_a40;
  auVar3._20_4_ = local_a40;
  auVar3._24_4_ = local_a40;
  auVar3._28_4_ = local_a40;
  auVar2._4_4_ = local_a60;
  auVar2._0_4_ = local_a60;
  auVar2._8_4_ = local_a60;
  auVar2._12_4_ = local_a60;
  auVar2._16_4_ = local_a60;
  auVar2._20_4_ = local_a60;
  auVar2._24_4_ = local_a60;
  auVar2._28_4_ = local_a60;
  uVar12 = 0x20;
  do {
    lVar11 = 0;
    uVar16 = uVar12;
    do {
      auVar21 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar16 ^ 7) * 4),
                            *(undefined1 (*) [32])(puVar7 + lVar11));
      auVar19 = vpsubd_avx2(*(undefined1 (*) [32])(puVar7 + lVar11),
                            *(undefined1 (*) [32])(local_840 + (uVar16 ^ 7) * 4));
      auVar21 = vpmaxsd_avx2(auVar21,auVar3);
      auVar18 = vpminsd_avx2(auVar21,auVar2);
      auVar21 = vpmaxsd_avx2(auVar19,auVar3);
      auVar21 = vpminsd_avx2(auVar21,auVar2);
      *(undefined1 (*) [32])(puVar7 + lVar11) = auVar18;
      *(undefined1 (*) [32])(local_840 + (uVar16 ^ 7) * 4) = auVar21;
      auVar21 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar16 ^ 8) * 4),
                            *(undefined1 (*) [32])(local_840 + (uVar16 ^ 0xf) * 4));
      auVar19 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar16 ^ 0xf) * 4),
                            *(undefined1 (*) [32])(local_840 + (uVar16 ^ 8) * 4));
      auVar21 = vpmaxsd_avx2(auVar21,auVar3);
      auVar18 = vpminsd_avx2(auVar21,auVar2);
      auVar21 = vpmaxsd_avx2(auVar19,auVar3);
      auVar21 = vpminsd_avx2(auVar21,auVar2);
      *(undefined1 (*) [32])(local_840 + (uVar16 ^ 0xf) * 4) = auVar18;
      *(undefined1 (*) [32])(local_840 + (uVar16 ^ 8) * 4) = auVar21;
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x80);
    puVar7 = puVar7 + 0x200;
    uVar10 = (uint)uVar12;
    uVar12 = uVar12 + 0x10;
  } while (uVar10 < 0x30);
  auVar39._4_4_ = iVar17;
  auVar39._0_4_ = iVar17;
  auVar39._8_4_ = iVar17;
  auVar39._12_4_ = iVar17;
  auVar39._16_4_ = iVar17;
  auVar39._20_4_ = iVar17;
  auVar39._24_4_ = iVar17;
  auVar39._28_4_ = iVar17;
  pauVar8 = &local_640;
  local_760 = local_840[0];
  lStack_758 = local_840[1];
  lStack_750 = local_840[2];
  lStack_748 = local_840[3];
  local_780 = local_820[0];
  lStack_778 = local_820[1];
  lStack_770 = local_820[2];
  lStack_768 = local_820[3];
  local_7a0 = local_800;
  lStack_798 = lStack_7f8;
  lStack_790 = lStack_7f0;
  lStack_788 = lStack_7e8;
  local_7c0 = local_7e0;
  lStack_7b8 = lStack_7d8;
  lStack_7b0 = lStack_7d0;
  lStack_7a8 = lStack_7c8;
  auVar2 = vpmulld_avx2(local_700,auVar39);
  auVar3 = vpmulld_avx2(local_6a0,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpaddd_avx2(local_6a0,local_700);
  auVar2 = vpmulld_avx2(auVar2,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_6a0 = vpsrad_avx2(auVar2,auVar56);
  local_700 = auVar3;
  auVar2 = vpmulld_avx2(local_6e0,auVar39);
  auVar3 = vpmulld_avx2(local_6c0,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpaddd_avx2(local_6c0,local_6e0);
  auVar2 = vpmulld_avx2(auVar2,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_6c0 = vpsrad_avx2(auVar2,auVar56);
  local_6e0 = auVar3;
  auVar6._4_4_ = local_a40;
  auVar6._0_4_ = local_a40;
  auVar6._8_4_ = local_a40;
  auVar6._12_4_ = local_a40;
  auVar6._16_4_ = local_a40;
  auVar6._20_4_ = local_a40;
  auVar6._24_4_ = local_a40;
  auVar6._28_4_ = local_a40;
  auVar5._4_4_ = local_a60;
  auVar5._0_4_ = local_a60;
  auVar5._8_4_ = local_a60;
  auVar5._12_4_ = local_a60;
  auVar5._16_4_ = local_a60;
  auVar5._20_4_ = local_a60;
  auVar5._24_4_ = local_a60;
  auVar5._28_4_ = local_a60;
  uVar12 = 0x10;
  do {
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 7) * 4),*pauVar8);
    auVar21 = vpsubd_avx2(*pauVar8,*(undefined1 (*) [32])(local_840 + (uVar12 ^ 7) * 4));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar21,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *pauVar8 = auVar3;
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 7) * 4) = auVar2;
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 8) * 4),
                         *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4));
    auVar21 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4),
                          *(undefined1 (*) [32])(local_840 + (uVar12 ^ 8) * 4));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar21,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4) = auVar3;
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 8) * 4) = auVar2;
    uVar12 = uVar12 + 1;
    pauVar8 = pauVar8 + 1;
  } while (uVar12 != 0x14);
  pauVar8 = &local_660;
  auVar2 = vpmulld_avx2(local_3c0,auVar54);
  auVar3 = vpmulld_avx2(local_e0,auVar42);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_3a0,auVar54);
  auVar21 = vpmulld_avx2(local_100,auVar42);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar21 = vpmulld_avx2(local_380,auVar54);
  auVar18 = vpmulld_avx2(local_120,auVar42);
  auVar21 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpaddd_avx2(auVar21,auVar18);
  auVar18 = vpmulld_avx2(local_360,auVar54);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar19 = vpmulld_avx2(local_140,auVar42);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar19 = vpmulld_avx2(local_360,auVar42);
  auVar22 = vpmulld_avx2(local_140,auVar55);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar19 = vpaddd_avx2(auVar22,auVar19);
  auVar22 = vpsrad_avx2(auVar2,auVar56);
  auVar23 = vpsrad_avx2(auVar3,auVar56);
  auVar21 = vpsrad_avx2(auVar21,auVar56);
  local_360 = vpsrad_avx2(auVar18,auVar56);
  local_140 = vpsrad_avx2(auVar19,auVar56);
  auVar2 = vpmulld_avx2(local_380,auVar42);
  auVar3 = vpmulld_avx2(local_120,auVar55);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar56 = ZEXT416((uint)bit);
  local_120 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(auVar42,local_3a0);
  auVar3 = vpmulld_avx2(local_100,auVar55);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_100 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(auVar42,local_3c0);
  auVar3 = vpmulld_avx2(auVar55,local_e0);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  local_e0 = vpsrad_avx2(auVar2,auVar56);
  local_3c0 = auVar22;
  local_3a0 = auVar23;
  local_380 = auVar21;
  auVar2 = vpmulld_avx2(local_340,auVar35);
  auVar3 = vpmulld_avx2(local_160,auVar54);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_320,auVar35);
  auVar21 = vpmulld_avx2(local_180,auVar54);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar21 = vpmulld_avx2(local_300,auVar35);
  auVar18 = vpmulld_avx2(local_1a0,auVar54);
  auVar21 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpaddd_avx2(auVar21,auVar18);
  auVar19 = vpmulld_avx2(local_2e0,auVar35);
  auVar18 = vpmulld_avx2(local_2e0,auVar54);
  auVar22 = vpmulld_avx2(local_1c0,auVar42);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar22);
  auVar22 = vpmulld_avx2(local_1c0,auVar54);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_1c0 = vpsrad_avx2(auVar18,auVar56);
  auVar18 = vpaddd_avx2(auVar22,auVar19);
  auVar19 = vpmulld_avx2(local_300,auVar54);
  auVar22 = vpmulld_avx2(local_1a0,auVar42);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar19 = vpaddd_avx2(auVar19,auVar22);
  local_1a0 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpmulld_avx2(local_320,auVar54);
  auVar22 = vpmulld_avx2(local_180,auVar42);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar19 = vpaddd_avx2(auVar19,auVar22);
  local_180 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpmulld_avx2(auVar54,local_340);
  auVar22 = vpmulld_avx2(local_160,auVar42);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar19 = vpaddd_avx2(auVar19,auVar22);
  local_340 = vpsrad_avx2(auVar2,auVar56);
  local_160 = vpsrad_avx2(auVar19,auVar56);
  local_320 = vpsrad_avx2(auVar3,auVar56);
  local_300 = vpsrad_avx2(auVar21,auVar56);
  local_2e0 = vpsrad_avx2(auVar18,auVar56);
  lVar11 = 0;
  do {
    auVar2 = vpaddd_avx2(*pauVar8,*(undefined1 (*) [32])((long)local_840 + lVar11));
    auVar21 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar11),*pauVar8);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar21,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])((long)local_840 + lVar11) = auVar3;
    *pauVar8 = auVar2;
    lVar11 = lVar11 + 0x20;
    pauVar8 = pauVar8 + -1;
  } while (lVar11 != 0x100);
  pauVar8 = &local_440;
  auVar2 = vpmulld_avx2(local_5c0,auVar39);
  auVar3 = vpmulld_avx2(local_4e0,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar3 = vpmulld_avx2(local_5a0,auVar39);
  auVar21 = vpmulld_avx2(local_500,auVar47);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar21 = vpmulld_avx2(local_580,auVar39);
  auVar18 = vpmulld_avx2(local_520,auVar47);
  auVar21 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpaddd_avx2(auVar21,auVar18);
  auVar18 = vpmulld_avx2(local_560,auVar39);
  auVar19 = vpmulld_avx2(local_540,auVar47);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar19 = vpaddd_avx2(local_540,local_560);
  auVar19 = vpmulld_avx2(auVar19,auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_540 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpaddd_avx2(local_520,local_580);
  auVar19 = vpmulld_avx2(auVar19,auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_520 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpaddd_avx2(local_500,local_5a0);
  auVar19 = vpmulld_avx2(auVar19,auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_500 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpaddd_avx2(local_4e0,local_5c0);
  local_5c0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(auVar19,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_4e0 = vpsrad_avx2(auVar2,auVar56);
  local_5a0 = vpsrad_avx2(auVar3,auVar56);
  local_580 = vpsrad_avx2(auVar21,auVar56);
  local_560 = vpsrad_avx2(auVar18,auVar56);
  uVar12 = 0x20;
  do {
    auVar2 = vpaddd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4),*pauVar8);
    auVar21 = vpsubd_avx2(*pauVar8,*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4));
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar21,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *pauVar8 = auVar3;
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4) = auVar2;
    uVar12 = uVar12 + 1;
    pauVar8 = pauVar8 + 1;
  } while (uVar12 != 0x28);
  uVar12 = 0x30;
  pauVar8 = &local_240;
  do {
    auVar2 = vpaddd_avx2(*pauVar8,*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4));
    auVar21 = vpsubd_avx2(*(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4),*pauVar8);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar21,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])(local_840 + (uVar12 ^ 0xf) * 4) = auVar3;
    *pauVar8 = auVar2;
    uVar12 = uVar12 + 1;
    pauVar8 = pauVar8 + 1;
  } while (uVar12 != 0x38);
  pauVar8 = &local_460;
  lVar11 = 0;
  do {
    auVar2 = vpaddd_avx2(*pauVar8,*(undefined1 (*) [32])((long)local_840 + lVar11));
    auVar21 = vpsubd_avx2(*(undefined1 (*) [32])((long)local_840 + lVar11),*pauVar8);
    auVar2 = vpmaxsd_avx2(auVar2,auVar6);
    auVar3 = vpminsd_avx2(auVar2,auVar5);
    auVar2 = vpmaxsd_avx2(auVar21,auVar6);
    auVar2 = vpminsd_avx2(auVar2,auVar5);
    *(undefined1 (*) [32])((long)local_840 + lVar11) = auVar3;
    *pauVar8 = auVar2;
    lVar11 = lVar11 + 0x20;
    pauVar8 = pauVar8 + -1;
  } while (lVar11 != 0x200);
  auVar2 = vpmulld_avx2(local_340,auVar39);
  auVar3 = vpmulld_avx2(local_160,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_320,auVar39);
  auVar21 = vpmulld_avx2(local_180,auVar47);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar21,auVar3);
  auVar21 = vpmulld_avx2(local_300,auVar39);
  auVar18 = vpmulld_avx2(local_1a0,auVar47);
  auVar21 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpaddd_avx2(auVar21,auVar18);
  auVar18 = vpmulld_avx2(local_2e0,auVar39);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  auVar19 = vpmulld_avx2(local_1c0,auVar47);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar19 = vpaddd_avx2(local_1c0,local_2e0);
  auVar23 = vpsrad_avx2(auVar2,auVar56);
  auVar24 = vpsrad_avx2(auVar3,auVar56);
  auVar25 = vpsrad_avx2(auVar21,auVar56);
  local_2e0 = vpsrad_avx2(auVar18,auVar56);
  auVar2 = vpmulld_avx2(auVar19,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_1c0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpaddd_avx2(local_1a0,local_300);
  auVar2 = vpmulld_avx2(auVar2,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_1a0 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpaddd_avx2(local_180,local_320);
  auVar2 = vpmulld_avx2(auVar2,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_180 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpaddd_avx2(local_160,local_340);
  auVar2 = vpmulld_avx2(auVar2,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  local_160 = vpsrad_avx2(auVar2,auVar56);
  auVar2 = vpmulld_avx2(local_2c0,auVar39);
  auVar3 = vpmulld_avx2(local_1e0,auVar47);
  auVar2 = vpaddd_avx2(auVar2,auVar20);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpmulld_avx2(local_2a0,auVar39);
  auVar21 = vpmulld_avx2(local_200,auVar47);
  auVar3 = vpaddd_avx2(auVar3,auVar20);
  auVar3 = vpaddd_avx2(auVar3,auVar21);
  auVar21 = vpmulld_avx2(local_280,auVar39);
  auVar18 = vpmulld_avx2(local_220,auVar47);
  auVar21 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpaddd_avx2(auVar18,auVar21);
  auVar19 = vpmulld_avx2(local_260,auVar39);
  auVar18 = vpaddd_avx2(local_240,local_260);
  auVar22 = vpmulld_avx2(local_240,auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  auVar18 = vpmulld_avx2(auVar18,auVar47);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  local_240 = vpsrad_avx2(auVar18,auVar56);
  auVar18 = vpaddd_avx2(auVar19,auVar22);
  auVar19 = vpaddd_avx2(local_220,local_280);
  auVar22 = vpaddd_avx2(local_2a0,local_200);
  auVar19 = vpmulld_avx2(auVar19,auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_220 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpmulld_avx2(auVar22,auVar47);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  local_200 = vpsrad_avx2(auVar19,auVar56);
  auVar19 = vpaddd_avx2(local_1e0,local_2c0);
  auVar19 = vpmulld_avx2(auVar19,auVar47);
  local_2c0 = vpsrad_avx2(auVar2,auVar56);
  local_2a0 = vpsrad_avx2(auVar3,auVar56);
  local_280 = vpsrad_avx2(auVar21,auVar56);
  local_260 = vpsrad_avx2(auVar18,auVar56);
  auVar20 = vpaddd_avx2(auVar19,auVar20);
  local_1e0 = vpsrad_avx2(auVar20,auVar56);
  iStack_a5c = local_a60;
  iStack_a58 = local_a60;
  iStack_a54 = local_a60;
  iStack_a50 = local_a60;
  iStack_a4c = local_a60;
  iStack_a48 = local_a60;
  iStack_a44 = local_a60;
  iStack_a3c = local_a40;
  iStack_a38 = local_a40;
  iStack_a34 = local_a40;
  iStack_a30 = local_a40;
  iStack_a2c = local_a40;
  iStack_a28 = local_a40;
  iStack_a24 = local_a40;
  local_340 = auVar23;
  local_320 = auVar24;
  local_300 = auVar25;
  idct64_stage11_avx2(&local_840,out,do_cols,bd,out_shift,(__m256i *)&local_a40,
                      (__m256i *)&local_a60);
  return;
}

Assistant:

static void idct64_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  const __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  const __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  const __m256i cospi_m28_m36 = pair_set_w16_epi16(-cospi[28], -cospi[36]);
  const __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  const __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  const __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  const __m256i cospi_m12_m52 = pair_set_w16_epi16(-cospi[12], -cospi[52]);
  const __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  const __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  const __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  const __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[8] = input[4];
  x[16] = input[2];
  x[24] = input[6];
  x[32] = input[1];
  x[40] = input[5];
  x[48] = input[3];
  x[56] = input[7];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[38] = x[39];
  x[41] = x[40];
  x[46] = x[47];
  x[49] = x[48];
  x[54] = x[55];
  x[57] = x[56];
  x[62] = x[63];

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  x[17] = x[16];
  x[22] = x[23];
  x[25] = x[24];
  x[30] = x[31];
  btf_16_w16_avx2(cospi_m04_p60, cospi_p60_p04, &x[33], &x[62], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m28_m36, cospi_m36_p28, &x[38], &x[57], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m20_p44, cospi_p44_p20, &x[41], &x[54], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m12_m52, cospi_m52_p12, &x[46], &x[49], _r,
                  INV_COS_BIT);

  // stage 5
  x[9] = x[8];
  x[14] = x[15];
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x[17], &x[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x[22], &x[25], _r,
                  INV_COS_BIT);
  x[35] = x[32];
  x[34] = x[33];
  x[36] = x[39];
  x[37] = x[38];
  x[43] = x[40];
  x[42] = x[41];
  x[44] = x[47];
  x[45] = x[46];
  x[51] = x[48];
  x[50] = x[49];
  x[52] = x[55];
  x[53] = x[54];
  x[59] = x[56];
  x[58] = x[57];
  x[60] = x[63];
  x[61] = x[62];

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  x[19] = x[16];
  x[18] = x[17];
  x[20] = x[23];
  x[21] = x[22];
  x[27] = x[24];
  x[26] = x[25];
  x[28] = x[31];
  x[29] = x[30];
  idct64_stage6_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  x[11] = x[8];
  x[10] = x[9];
  x[12] = x[15];
  x[13] = x[14];
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  x[7] = x[0];
  x[6] = x[1];
  x[5] = x[2];
  x[4] = x[3];
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}